

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O3

void __thiscall NutFunction::GenerateBodySource(NutFunction *this,int n,ostream *out)

{
  uint uVar1;
  pointer pLVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pIVar4;
  pointer pLVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  long *plVar7;
  ostream *poVar8;
  LocalVariableExpression *__p;
  ExpressionPtr *pEVar9;
  pointer pLVar10;
  long lVar11;
  int iVar12;
  int *piVar13;
  pointer pOVar14;
  pointer pLVar15;
  pointer pLVar16;
  ulong uVar17;
  char *pcVar18;
  char cVar19;
  pointer obj;
  bool bVar20;
  VMState state;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  VMState local_98;
  
  cVar19 = (char)out;
  if (this->m_IsGenerator == true) {
    iVar12 = n;
    if (0 < n) {
      do {
        std::ostream::put(cVar19);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"// Function is a generator.",0x1b);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar19);
    std::ostream::put(cVar19);
    std::ostream::flush();
  }
  if (g_DebugMode == true) {
    iVar12 = n;
    if (0 < n) {
      do {
        std::ostream::put(cVar19);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"// Defaults:",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar19);
    std::ostream::put(cVar19);
    std::ostream::flush();
    piVar13 = (this->m_DefaultParams).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (piVar13 !=
        (this->m_DefaultParams).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        iVar12 = n;
        if (0 < n) {
          do {
            std::ostream::put(cVar19);
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"//\t",3);
        plVar7 = (long *)std::ostream::operator<<((ostream *)out,*piVar13);
        std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
        std::ostream::put((char)plVar7);
        std::ostream::flush();
        piVar13 = piVar13 + 1;
      } while (piVar13 !=
               (this->m_DefaultParams).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar19);
    std::ostream::put(cVar19);
    std::ostream::flush();
    iVar12 = n;
    if (0 < n) {
      do {
        std::ostream::put(cVar19);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"// Literals:",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar19);
    std::ostream::put(cVar19);
    std::ostream::flush();
    obj = (this->m_Literals).super__Vector_base<SqObject,_std::allocator<SqObject>_>._M_impl.
          super__Vector_impl_data._M_start;
    if (obj != (this->m_Literals).super__Vector_base<SqObject,_std::allocator<SqObject>_>._M_impl.
               super__Vector_impl_data._M_finish) {
      do {
        iVar12 = n;
        if (0 < n) {
          do {
            std::ostream::put(cVar19);
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"//\t",3);
        poVar8 = operator<<(out,obj);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        obj = obj + 1;
      } while (obj != (this->m_Literals).super__Vector_base<SqObject,_std::allocator<SqObject>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar19);
    std::ostream::put(cVar19);
    std::ostream::flush();
    iVar12 = n;
    if (0 < n) {
      do {
        std::ostream::put(cVar19);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"// Outer values:",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar19);
    std::ostream::put(cVar19);
    std::ostream::flush();
    pOVar14 = (this->m_OuterValues).
              super__Vector_base<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pOVar14 !=
        (this->m_OuterValues).
        super__Vector_base<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        iVar12 = n;
        if (0 < n) {
          do {
            std::ostream::put(cVar19);
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"//\t",3);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)out,pOVar14->type);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  src=",6);
        poVar8 = operator<<(poVar8,&pOVar14->src);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  name=",7);
        poVar8 = operator<<(poVar8,&pOVar14->name);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        pOVar14 = pOVar14 + 1;
      } while (pOVar14 !=
               (this->m_OuterValues).
               super__Vector_base<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar19);
    std::ostream::put(cVar19);
    std::ostream::flush();
    iVar12 = n;
    if (0 < n) {
      do {
        std::ostream::put(cVar19);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"// Local identifiers:",0x15);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar19);
    std::ostream::put(cVar19);
    std::ostream::flush();
    pLVar16 = (this->m_Locals).
              super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar16 !=
        (this->m_Locals).
        super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      do {
        iVar12 = n;
        if (0 < n) {
          do {
            std::ostream::put(cVar19);
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"//   -",6);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,pLVar16[-1].name._M_dataplus._M_p,pLVar16[-1].name._M_string_length)
        ;
        iVar12 = (int)pLVar16[-1].name._M_string_length;
        if (0 < 10 - iVar12) {
          iVar12 = iVar12 + -10;
          do {
            std::ostream::put((char)poVar8);
            iVar12 = iVar12 + 1;
          } while (iVar12 != 0);
        }
        pLVar10 = pLVar16 + -1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," // pos=",8);
        poVar8 = std::ostream::_M_insert<long>((long)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  start=",8);
        poVar8 = std::ostream::_M_insert<long>((long)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  end=",6);
        poVar8 = std::ostream::_M_insert<long>((long)poVar8);
        bVar20 = pLVar16[-1].foreachLoopState != false;
        pcVar18 = "";
        if (bVar20) {
          pcVar18 = " foreach state";
        }
        lVar11 = 0;
        if (bVar20) {
          lVar11 = 0xe;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar18,lVar11);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        pLVar16 = pLVar10;
      } while (pLVar10 !=
               (this->m_Locals).
               super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
               ._M_impl.super__Vector_impl_data._M_start);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar19);
    std::ostream::put(cVar19);
    std::ostream::flush();
    iVar12 = n;
    if (0 < n) {
      do {
        std::ostream::put(cVar19);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"// Instructions:",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar19);
    std::ostream::put(cVar19);
    std::ostream::flush();
    if ((this->m_Instructions).
        super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->m_Instructions).
        super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pLVar15 = (this->m_LineInfos).
                super__Vector_base<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar17 = 0;
      do {
        pLVar2 = (this->m_LineInfos).
                 super__Vector_base<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pLVar15 != pLVar2) {
          uVar1 = (uint)pLVar15->op;
          pLVar5 = pLVar15;
          while ((pLVar15 = pLVar5, uVar1 <= uVar17 && (pLVar15 = pLVar5 + 1, pLVar15 != pLVar2))) {
            uVar1 = (uint)pLVar5[1].op;
            pLVar5 = pLVar15;
          }
        }
        iVar12 = n;
        if (0 < n) {
          do {
            std::ostream::put(cVar19);
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"// ",3);
        lVar11 = *(long *)out;
        poVar8 = out + *(long *)(lVar11 + -0x18);
        if (out[*(long *)(lVar11 + -0x18) + 0xe1] == (ostream)0x0) {
          std::ios::widen((char)poVar8);
          poVar8[0xe1] = (ostream)0x1;
          lVar11 = *(long *)out;
        }
        poVar8[0xe0] = (ostream)0x20;
        *(undefined8 *)(out + *(long *)(lVar11 + -0x18) + 0x10) = 5;
        poVar8 = std::ostream::_M_insert<long>((long)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
        PrintOpcode(this,out,(int)uVar17,
                    (this->m_Instructions).
                    super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar17);
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar19);
        std::ostream::put(cVar19);
        std::ostream::flush();
        uVar17 = uVar17 + 1;
      } while (uVar17 < (ulong)((long)(this->m_Instructions).
                                      super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_Instructions).
                                      super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    iVar12 = n;
    if (n < 1) {
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar19);
      std::ostream::put(cVar19);
      std::ostream::flush();
    }
    else {
      do {
        std::ostream::put(cVar19);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar19);
      std::ostream::put(cVar19);
      std::ostream::flush();
      iVar12 = n;
      do {
        std::ostream::put(cVar19);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"// Decompilation attempt:",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar19);
    std::ostream::put(cVar19);
    std::ostream::flush();
  }
  VMState::VMState(&local_98,this,this->m_StackSize);
  pLVar10 = (this->m_Locals).
            super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pLVar16 = (this->m_Locals).
            super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar16 != pLVar10) {
    do {
      if ((pLVar16[-1].start_op == 0) && (pLVar16[-1].foreachLoopState == false)) {
        __p = (LocalVariableExpression *)operator_new(0x28);
        (__p->super_VariableExpression).super_Expression._vptr_Expression =
             (_func_int **)&PTR_GetType_0012b898;
        (__p->super_VariableExpression).m_name._M_dataplus._M_p =
             (pointer)&(__p->super_VariableExpression).m_name.field_2;
        pcVar3 = pLVar16[-1].name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(__p->super_VariableExpression).m_name,pcVar3,
                   pcVar3 + pLVar16[-1].name._M_string_length);
        (__p->super_VariableExpression).super_Expression._vptr_Expression =
             (_func_int **)&PTR_GetType_0012bf88;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<LocalVariableExpression*>
                  (&_Stack_a0,__p);
        pEVar9 = VMState::AtStack(&local_98,pLVar16[-1].pos);
        _Var6._M_pi = _Stack_a0._M_pi;
        _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (pEVar9->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                  _M_pi;
        (pEVar9->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)__p;
        (pEVar9->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             _Var6._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
        }
        pLVar10 = (this->m_Locals).
                  super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      pLVar16 = pLVar16 + -1;
    } while (pLVar16 != pLVar10);
  }
  if (local_98.m_IP <
      (int)((ulong)((long)((local_98.m_Parent)->m_Instructions).
                          super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)((local_98.m_Parent)->m_Instructions).
                         super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    do {
      lVar11 = (long)local_98.m_IP;
      pIVar4 = (this->m_Instructions).
               super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((pIVar4[lVar11].op == '\x13') &&
          (((long)(this->m_Instructions).
                  super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar4 >> 3) + -1 == lVar11))
         && (pIVar4[lVar11].arg0 == -1)) {
        VMState::NextInstruction(&local_98);
      }
      else {
        DecompileStatement(this,&local_98);
      }
    } while (local_98.m_IP <
             (int)((ulong)((long)((local_98.m_Parent)->m_Instructions).
                                 super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)((local_98.m_Parent)->m_Instructions).
                                super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  VMState::PrintOutput(&local_98,out,n);
  if (local_98.m_JNZInstructions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_JNZInstructions.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.m_JNZInstructions.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_JNZInstructions.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::~vector
            (&local_98.m_Stack);
  if (local_98.m_Block.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.m_Block.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void NutFunction::GenerateBodySource( int n, std::ostream& out ) const
{
	//for( auto i = m_Functions.begin(); i != m_Functions.end(); ++i)
	//	i->GenerateFunctionSource(n, out, extraInfo);

	if (m_IsGenerator)
		out << indent(n) << "// Function is a generator." << std::endl;

	if (g_DebugMode)
	{
		out << indent(n) << "// Defaults:" << std::endl;
		for( std::vector<int>::const_iterator i = m_DefaultParams.begin(); i != m_DefaultParams.end(); ++i)
			out << indent(n) << "//\t" << *i << std::endl;
		
		out << std::endl;

		out << indent(n) << "// Literals:" << std::endl;
		for( std::vector<SqObject>::const_iterator i = m_Literals.begin(); i != m_Literals.end(); ++i)
			out << indent(n) << "//\t" << *i << std::endl;

		out << std::endl;

		out << indent(n) << "// Outer values:" << std::endl;
		for( vector<OuterValueInfo>::const_iterator i = m_OuterValues.begin(); i != m_OuterValues.end(); ++i)
			out << indent(n) << "//\t" << i->type << "  src=" << i->src << "  name=" << i->name << std::endl; 

		out << std::endl;

		out << indent(n) << "// Local identifiers:" << std::endl;
		for(vector<NutFunction::LocalVarInfo>::const_reverse_iterator i = m_Locals.rbegin(); i != m_Locals.rend(); ++i)
		{
			out << indent(n) << "//   -" << i->name << spaces(10 - i->name.size()) 
				<< " // pos=" << i->pos << "  start=" << i->start_op << "  end=" << i->end_op << (i->foreachLoopState ? " foreach state" : "") << std::endl;
		}

		out << std::endl;
		out << indent(n) << "// Instructions:" << std::endl;

		int64_t currentLine = 0;
		vector<LineInfo>::const_iterator lineInfo = m_LineInfos.begin();

		for(size_t i = 0; i < m_Instructions.size(); ++i)
		{
			while (lineInfo != m_LineInfos.end() && i >= (unsigned int)lineInfo->op)
			{
				currentLine = lineInfo->line;
				++lineInfo;
			}

			out << indent(n) << "// " << std::setfill(' ') << std::setw(5) << currentLine << "  ";
			PrintOpcode(out, (int)i, m_Instructions[i]);
			out << std::endl;
		}

		out << indent(n) << std::endl;
		out << indent(n) << "// Decompilation attempt:" << std::endl;
	}

	// Crate new state for decompiler virtual machine
	VMState state(*this, m_StackSize);

	// Set initial stack elements to local identifiers
	for(vector<NutFunction::LocalVarInfo>::const_reverse_iterator i = m_Locals.rbegin(); i != m_Locals.rend(); ++i)	
		if (i->start_op == 0 && !i->foreachLoopState)
			state.AtStack(i->pos) = ExpressionPtr(new LocalVariableExpression(i->name));

	// Decompiler loop
	while(!state.EndOfInstructions())
	{
		if (m_Instructions[state.IP()].op == OP_RETURN && (state.IP() == m_Instructions.size() - 1) && m_Instructions[state.IP()].arg0 == -1)
		{
			// This is last return statement in function - can be skipped
			state.NextInstruction();
			continue;	
		}

		DecompileStatement(state);
	}

	// Print decompiled code
	state.PrintOutput(out, n);
}